

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

ptrlen pubkey_blob_to_alg_name(ptrlen blob)

{
  ptrlen pVar1;
  undefined1 local_58 [8];
  BinarySource src [1];
  ptrlen blob_local;
  
  BinarySource_INIT__((BinarySource *)local_58,blob);
  pVar1 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
  return pVar1;
}

Assistant:

ptrlen pubkey_blob_to_alg_name(ptrlen blob)
{
    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, blob);
    return get_string(src);
}